

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuda_finder.cpp
# Opt level: O3

path * __thiscall
CudaFinder::get_install_dir(path *__return_storage_ptr__,CudaFinder *this,path *path_)

{
  _List *p_Var1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  int iVar5;
  path *ppVar6;
  path *ppVar7;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var8;
  path *ppVar9;
  bool bVar10;
  bool bVar11;
  bool local_74;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  std::filesystem::__cxx11::path::path(__return_storage_ptr__);
  p_Var1 = &path_->_M_cmpts;
  _Var8._M_head_impl =
       (path_->_M_cmpts)._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  if (((ulong)_Var8._M_head_impl & 3) == 0) {
    ppVar6 = (path *)std::filesystem::__cxx11::path::_List::begin();
    _Var8._M_head_impl =
         (p_Var1->_M_impl)._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    bVar10 = false;
    if (((ulong)_Var8._M_head_impl & 3) != 0) goto LAB_0010549b;
  }
  else {
    sVar2 = (path_->_M_pathname)._M_string_length;
    bVar10 = sVar2 == 0;
    if (((ulong)_Var8._M_head_impl & 3) != 0) {
      if (sVar2 == 0) {
        return __return_storage_ptr__;
      }
      ppVar6 = (path *)0x0;
LAB_0010549b:
      local_74 = true;
      bVar10 = false;
      ppVar7 = (path *)0x0;
      goto LAB_001054d7;
    }
    ppVar6 = (path *)0x0;
  }
  ppVar7 = (path *)std::filesystem::__cxx11::path::_List::end();
  _Var8._M_head_impl =
       (p_Var1->_M_impl)._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  if (((ulong)_Var8._M_head_impl & 3) == 0) {
    if (ppVar6 == ppVar7) {
      return __return_storage_ptr__;
    }
  }
  else if (bVar10 == false) {
    return __return_storage_ptr__;
  }
  local_74 = false;
LAB_001054d7:
  while( true ) {
    ppVar9 = path_;
    if (((ulong)_Var8._M_head_impl & 3) == 0) {
      ppVar9 = ppVar6;
    }
    pcVar3 = (ppVar9->_M_pathname)._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar3,pcVar3 + (ppVar9->_M_pathname)._M_string_length);
    plVar4 = local_50;
    if (local_48 == (this->m_target_version)._M_string_length) {
      if (local_48 == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_50,(this->m_target_version)._M_dataplus._M_p,local_48);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if (plVar4 != local_40) {
      operator_delete(plVar4,local_40[0] + 1);
    }
    if (bVar11) break;
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,ppVar9);
    _Var8._M_head_impl =
         (p_Var1->_M_impl)._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    ppVar9 = (path *)&ppVar6[1]._M_pathname._M_string_length;
    if (((ulong)_Var8._M_head_impl & 3) != 0) {
      bVar10 = true;
      ppVar9 = ppVar6;
    }
    bVar11 = bVar10 != local_74;
    if (((ulong)_Var8._M_head_impl & 3) == 0) {
      bVar11 = ppVar9 != ppVar7;
    }
    ppVar6 = ppVar9;
    if (!bVar11) {
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path CudaFinder::get_install_dir(const fs::path &path_)
{
  fs::path o_path;
  for (auto &p : path_)
    if (p.string() == m_target_version)
      break;
    else
      o_path /= p;
  return o_path;
}